

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
RemoveLast<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  LogMessage *other;
  Type *value;
  int iVar1;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  RepeatedPtrFieldBase *local_10;
  RepeatedPtrFieldBase *this_local;
  
  local_49 = 0;
  local_10 = this;
  if (this->current_size_ < 1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ff);
    local_49 = 1;
    other = LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage(&local_48);
  }
  iVar1 = this->current_size_ + -1;
  this->current_size_ = iVar1;
  value = cast<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                    (this->rep_->elements[iVar1]);
  GenericTypeHandler<google::protobuf::Message>::Clear(value);
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::RemoveLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  TypeHandler::Clear(cast<TypeHandler>(rep_->elements[--current_size_]));
}